

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc.cc
# Opt level: O0

bool __thiscall
aom::AV1RateControlRTC::GetSegmentationData
          (AV1RateControlRTC *this,AV1SegmentationData *segmentation_data)

{
  AV1SegmentationData *segmentation_data_local;
  AV1RateControlRTC *this_local;
  bool local_1;
  
  if ((this->cpi_->oxcf).q_cfg.aq_mode == '\0') {
    local_1 = false;
  }
  else if (this->cpi_->cyclic_refresh->apply_cyclic_refresh == 0) {
    local_1 = false;
  }
  else {
    segmentation_data->segmentation_map = (this->cpi_->enc_seg).map;
    segmentation_data->segmentation_map_size =
         (long)((this->cpi_->common).mi_params.mi_rows * (this->cpi_->common).mi_params.mi_cols);
    segmentation_data->delta_q = this->cpi_->cyclic_refresh->qindex_delta;
    segmentation_data->delta_q_size = 3;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool AV1RateControlRTC::GetSegmentationData(
    AV1SegmentationData *segmentation_data) const {
  if (cpi_->oxcf.q_cfg.aq_mode == 0) {
    return false;
  }
  // Don't update the segmentation map if cyclic refresh is not enabled.
  if (!cpi_->cyclic_refresh->apply_cyclic_refresh) {
    return false;
  }
  segmentation_data->segmentation_map = cpi_->enc_seg.map;
  segmentation_data->segmentation_map_size =
      cpi_->common.mi_params.mi_rows * cpi_->common.mi_params.mi_cols;
  segmentation_data->delta_q = cpi_->cyclic_refresh->qindex_delta;
  segmentation_data->delta_q_size = 3u;
  return true;
}